

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

bool __thiscall VulkanHppGenerator::isVectorByStructure(VulkanHppGenerator *this,string *type)

{
  bool bVar1;
  const_iterator cVar2;
  VulkanHppGenerator *this_00;
  _Alloc_hider local_38;
  undefined8 local_28;
  
  this_00 = (VulkanHppGenerator *)&stack0xffffffffffffffc8;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
          ::find(&(this->m_structs)._M_t,type);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_structs)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = false;
  }
  else {
    local_38._M_p = (pointer)&stack0xffffffffffffffd8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffffc8,"");
    bVar1 = describesVector(this_00,(StructureData *)(cVar2._M_node + 2),
                            (string *)&stack0xffffffffffffffc8);
    if (local_38._M_p != (pointer)&stack0xffffffffffffffd8) {
      operator_delete(local_38._M_p,local_28 + 1);
    }
  }
  return bVar1;
}

Assistant:

bool VulkanHppGenerator::isVectorByStructure( std::string const & type ) const
{
  auto structIt = m_structs.find( type );
  return ( structIt != m_structs.end() ) && describesVector( structIt->second );
}